

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_parameters
          (DG2Dot<dg::LLVMNode> *this,DGParameters<dg::LLVMNode> *params,int ind,bool formal)

{
  bool bVar1;
  iterator iVar2;
  iterator prefix;
  reference ppVar3;
  pointer ppVar4;
  DGParameterPair<dg::LLVMNode> *pDVar5;
  LLVMNode *pLVar6;
  int in_EDX;
  LLVMNode *in_RSI;
  DGParameters<dg::LLVMNode> *in_RDI;
  LLVMNode *noret;
  DGParameterPair<dg::LLVMNode> *p;
  DGParameterPair<dg::LLVMNode> *p_2;
  iterator E;
  iterator I;
  DGParameterPair<dg::LLVMNode> *p_1;
  pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_> it;
  iterator __end0;
  iterator __begin0;
  DGParameters<dg::LLVMNode> *__range3;
  Indent Ind;
  _Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>
  *in_stack_ffffffffffffff80;
  _Self local_68;
  _Self local_60;
  long *local_58;
  Value *local_50;
  long local_48;
  undefined8 local_40;
  int ind_00;
  DG2Dot<dg::LLVMNode> *in_stack_ffffffffffffffe0;
  
  Indent::Indent((Indent *)&stack0xffffffffffffffe4,in_EDX);
  iVar2 = DGParameters<dg::LLVMNode>::begin(in_RDI);
  prefix = DGParameters<dg::LLVMNode>::end(in_RDI);
  while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd0,(_Self *)&stack0xffffffffffffffc8
                                ), bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>::
             operator*((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>
                        *)0x1ca994);
    local_50 = ppVar3->first;
    local_48 = *(long *)&ppVar3->second;
    local_40 = *(undefined8 *)&ppVar3->field_0x10;
    local_58 = &local_48;
    if (local_48 == 0) {
      std::operator<<((ostream *)(in_RDI + 0xd0),"NO IN ARG");
    }
    else {
      dump_node(in_stack_ffffffffffffffe0,in_RSI,(int)((ulong)iVar2._M_node >> 0x20),
                (char *)prefix._M_node);
      dump_node_edges((DG2Dot<dg::LLVMNode> *)__end0._M_node,(LLVMNode *)it._16_8_,it._12_4_);
    }
    if (local_58[1] == 0) {
      std::operator<<((ostream *)(in_RDI + 0xd0),"NO OUT ARG");
    }
    else {
      dump_node(in_stack_ffffffffffffffe0,in_RSI,(int)((ulong)iVar2._M_node >> 0x20),
                (char *)prefix._M_node);
      dump_node_edges((DG2Dot<dg::LLVMNode> *)__end0._M_node,(LLVMNode *)it._16_8_,it._12_4_);
    }
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>::
    operator++(in_stack_ffffffffffffff80);
  }
  local_60._M_node = (_Base_ptr)DGParameters<dg::LLVMNode>::global_begin(in_RDI);
  local_68._M_node = (_Base_ptr)DGParameters<dg::LLVMNode>::global_end(in_RDI);
  while (bVar1 = std::operator!=(&local_60,&local_68), ind_00 = (int)((ulong)iVar2._M_node >> 0x20),
        bVar1) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>::
             operator->((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>
                         *)0x1caae2);
    if (*(long *)&ppVar4->second == 0) {
      std::operator<<((ostream *)(in_RDI + 0xd0),"NO GLOB IN ARG");
    }
    else {
      dump_node(in_stack_ffffffffffffffe0,in_RSI,(int)((ulong)iVar2._M_node >> 0x20),
                (char *)prefix._M_node);
      dump_node_edges((DG2Dot<dg::LLVMNode> *)__end0._M_node,(LLVMNode *)it._16_8_,it._12_4_);
    }
    if (*(long *)&ppVar4->field_0x10 == 0) {
      std::operator<<((ostream *)(in_RDI + 0xd0),"NO GLOB OUT ARG");
    }
    else {
      dump_node(in_stack_ffffffffffffffe0,in_RSI,(int)((ulong)iVar2._M_node >> 0x20),
                (char *)prefix._M_node);
      dump_node_edges((DG2Dot<dg::LLVMNode> *)__end0._M_node,(LLVMNode *)it._16_8_,it._12_4_);
    }
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>::
    operator++(in_stack_ffffffffffffff80);
  }
  pDVar5 = DGParameters<dg::LLVMNode>::getVarArg((DGParameters<dg::LLVMNode> *)0x1cabdb);
  if (pDVar5 != (DGParameterPair<dg::LLVMNode> *)0x0) {
    if (*(long *)pDVar5 == 0) {
      std::operator<<((ostream *)(in_RDI + 0xd0),"NO IN va ARG");
    }
    else {
      dump_node(in_stack_ffffffffffffffe0,in_RSI,ind_00,(char *)prefix._M_node);
      dump_node_edges((DG2Dot<dg::LLVMNode> *)__end0._M_node,(LLVMNode *)it._16_8_,it._12_4_);
    }
    if (*(long *)(pDVar5 + 8) == 0) {
      std::operator<<((ostream *)(in_RDI + 0xd0),"NO OUT ARG");
    }
    else {
      dump_node(in_stack_ffffffffffffffe0,in_RSI,ind_00,(char *)prefix._M_node);
      dump_node_edges((DG2Dot<dg::LLVMNode> *)__end0._M_node,(LLVMNode *)it._16_8_,it._12_4_);
    }
  }
  pLVar6 = DGParameters<dg::LLVMNode>::getNoReturn((DGParameters<dg::LLVMNode> *)0x1caca5);
  if (pLVar6 != (LLVMNode *)0x0) {
    dump_node(in_stack_ffffffffffffffe0,in_RSI,ind_00,(char *)prefix._M_node);
    dump_node_edges((DG2Dot<dg::LLVMNode> *)__end0._M_node,(LLVMNode *)it._16_8_,it._12_4_);
  }
  return;
}

Assistant:

void dump_parameters(DGParameters<NodeT> *params, int ind, bool formal) {
        Indent Ind(ind);

        // FIXME
        // out << Ind << "/* Input parameters */\n";
        // dumpBB(params->getBBIn(), data);
        // out << Ind << "/* Output parameters */\n";
        // dumpBB(params->getBBOut(), data);

        // dump all the nodes again to get the names
        for (auto it : *params) {
            auto &p = it.second;
            if (p.in) {
                dump_node(p.in, ind, formal ? "[f] IN ARG" : "IN ARG");
                dump_node_edges(p.in, ind);
            } else
                out << "NO IN ARG";

            if (p.out) {
                dump_node(p.out, ind, formal ? "[f] OUT ARG" : "OUT ARG");
                dump_node_edges(p.out, ind);
            } else
                out << "NO OUT ARG";
        }

        for (auto I = params->global_begin(), E = params->global_end(); I != E;
             ++I) {
            auto &p = I->second;
            if (p.in) {
                dump_node(p.in, ind, formal ? "[f] GLOB IN" : "GLOB IN");
                dump_node_edges(p.in, ind);
            } else
                out << "NO GLOB IN ARG";

            if (p.out) {
                dump_node(p.out, ind, formal ? "[f] GLOB OUT" : "GLOB OUT");
                dump_node_edges(p.out, ind);
            } else
                out << "NO GLOB OUT ARG";
        }

        auto p = params->getVarArg();
        if (p) {
            if (p->in) {
                dump_node(p->in, ind, "[va] IN ARG");
                dump_node_edges(p->in, ind);
            } else
                out << "NO IN va ARG";

            if (p->out) {
                dump_node(p->out, ind, "[va] OUT ARG");
                dump_node_edges(p->out, ind);
            } else
                out << "NO OUT ARG";
        }

        if (auto *noret = params->getNoReturn()) {
            dump_node(noret, ind, "[noret]");
            dump_node_edges(noret, ind);
        }
    }